

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Vec_Ptr_t * collectBarrierDisjunctions(Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers)

{
  int nCap;
  int iVar1;
  Vec_Ptr_t *p;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  int i;
  Aig_Man_t *pAig;
  Aig_Obj_t *p1;
  
  if ((vBarriers == (Vec_Ptr_t *)0x0) || (nCap = vBarriers->nSize, nCap < 1)) {
    p = (Vec_Ptr_t *)0x0;
  }
  else {
    p = Vec_PtrAlloc(nCap);
    for (i = 0; i != nCap; i = i + 1) {
      pvVar2 = Vec_PtrEntry(vBarriers,i);
      iVar1 = *(int *)((long)pvVar2 + 4);
      if (iVar1 < 1) {
        __assert_fail("Vec_IntSize( vIthBarrier ) >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x8e,
                      "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                     );
      }
      p1 = (Aig_Obj_t *)((ulong)pAigNew->pConst1 ^ 1);
      for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
        pAig = pAigOld;
        pAVar3 = Aig_ManCo(pAigOld,*(int *)(*(long *)((long)pvVar2 + 8) + lVar4 * 4));
        pAVar3 = driverToPoNew(pAig,pAVar3);
        p1 = Aig_Or(pAigNew,pAVar3,p1);
        iVar1 = *(int *)((long)pvVar2 + 4);
      }
      if (p1 == (Aig_Obj_t *)0x0) {
        __assert_fail("pObjBarrier",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                      ,0x98,
                      "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                     );
      }
      Vec_PtrPush(p,p1);
    }
    if (p->nSize != nCap) {
      __assert_fail("Vec_PtrSize( vNewBarrierSignals ) == barrierCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                    ,0x9b,
                    "Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)");
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t *collectBarrierDisjunctions(Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers)
{
	int barrierCount, i, j, jElem;
	Vec_Int_t *vIthBarrier;
	Aig_Obj_t *pObjBarrier, *pObjCurr, *pObjTargetPoOld;
	Vec_Ptr_t *vNewBarrierSignals;

	if( vBarriers == NULL )
		return NULL;
	barrierCount = Vec_PtrSize( vBarriers );
	if( barrierCount <= 0 )
		return NULL;

	vNewBarrierSignals = Vec_PtrAlloc( barrierCount );

	for( i=0; i<barrierCount; i++ )
	{
		vIthBarrier = (Vec_Int_t *)Vec_PtrEntry( vBarriers, i );
		assert( Vec_IntSize( vIthBarrier ) >= 1 );
		pObjBarrier = Aig_Not(Aig_ManConst1(pAigNew));
		Vec_IntForEachEntry( vIthBarrier, jElem, j )
		{
			pObjTargetPoOld = Aig_ManCo( pAigOld, jElem );
			//Aig_ObjPrint( pAigOld, pObjTargetPoOld );
			//printf("\n");
			pObjCurr = driverToPoNew( pAigOld, pObjTargetPoOld );
			pObjBarrier = Aig_Or( pAigNew, pObjCurr, pObjBarrier );
		}
		assert( pObjBarrier );
		Vec_PtrPush(vNewBarrierSignals, pObjBarrier);
	}
	assert( Vec_PtrSize( vNewBarrierSignals ) == barrierCount );

	return vNewBarrierSignals;
}